

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_playback.c
# Opt level: O0

void decode_alcGetProcAddress(void)

{
  ALCdevice *device_00;
  char *funcname_00;
  void *retval_00;
  void *retval;
  ALCchar *funcname;
  ALCdevice *device;
  CallerInfo callerinfo;
  
  IO_ENTRYINFO((CallerInfo *)&device);
  if (io_failure == 0) {
    device_00 = (ALCdevice *)IO_PTR();
    funcname_00 = IO_STRING();
    retval_00 = IO_PTR();
    if (io_failure == 0) {
      visit_alcGetProcAddress((CallerInfo *)&device,retval_00,device_00,funcname_00);
    }
  }
  return;
}

Assistant:

static void decode_alcGetProcAddress(void)
{
    IO_START(alcGetProcAddress);
    ALCdevice *device = (ALCdevice *) IO_PTR();
    const ALCchar *funcname = (const ALCchar *) IO_STRING();
    void *retval = IO_PTR();
    if (!io_failure) visit_alcGetProcAddress(&callerinfo, retval, device, funcname);
    IO_END();

}